

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O0

void __thiscall submitter::operator()(submitter *this)

{
  function *pfVar1;
  service *in_RDI;
  runner *unaff_retaddr;
  runner *__f;
  function<void_()> *in_stack_ffffffffffffffa0;
  runner local_50;
  
  pfVar1 = (function *)cppcms::service::thread_pool();
  __f = &local_50;
  runner::runner(unaff_retaddr,in_RDI);
  std::function<void()>::function<runner,void>(in_stack_ffffffffffffffa0,__f);
  cppcms::thread_pool::post(pfVar1);
  std::function<void_()>::~function((function<void_()> *)0x129d64);
  runner::~runner((runner *)0x129d6e);
  return;
}

Assistant:

void operator()() const
	{
		srv_->thread_pool().post(runner(*srv_));
	}